

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbar_mugshot.cpp
# Opt level: O1

FTexture * __thiscall
FMugShot::GetFace(FMugShot *this,player_t *player,char *default_face,int accuracy,
                 StateFlags stateflags)

{
  undefined8 *puVar1;
  int direction;
  int iVar2;
  FTexture *pFVar3;
  int level;
  undefined8 *puVar4;
  char *skin_face;
  int iVar5;
  
  direction = UpdateState(this,player,stateflags);
  iVar2 = player->mo->MugShotMaxHealth;
  if (iVar2 < 0) {
    iVar2 = APlayerPawn::GetMaxHealth(player->mo);
  }
  else if (iVar2 == 0) {
    iVar2 = 100;
  }
  iVar5 = accuracy * (iVar2 / accuracy);
  level = -1;
  do {
    level = level + 1;
    iVar5 = iVar5 - iVar2 / accuracy;
  } while (player->health < iVar5);
  if (this->CurrentState == (FMugShotState *)0x0) {
    return (FTexture *)0x0;
  }
  puVar1 = (undefined8 *)
           ((long)&((player->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes)->Next +
           (ulong)(((player->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                    Size - 1 & 0x1ea) * 0x18));
  do {
    puVar4 = puVar1;
    puVar1 = (undefined8 *)*puVar4;
  } while (*(int *)(puVar4 + 1) != 0x1ea);
  if ((stateflags & CUSTOM) == STANDARD) {
    if (player->morphTics == 0) {
      skin_face = skins[*(int *)(puVar4[2] + 0x28)].face;
    }
    else {
      skin_face = (player->MorphedPlayerClass->Face).Chars;
    }
  }
  else {
    skin_face = (char *)0x0;
  }
  pFVar3 = FMugShotState::GetCurrentFrameTexture
                     (this->CurrentState,default_face,skin_face,level,direction);
  return pFVar3;
}

Assistant:

FTexture *FMugShot::GetFace(player_t *player, const char *default_face, int accuracy, StateFlags stateflags)
{
	int angle = UpdateState(player, stateflags);
	int level = 0;
	int max = player->mo->MugShotMaxHealth;
	if (max < 0)
	{
		max = player->mo->GetMaxHealth();
	}
	else if (max == 0)
	{
		max = 100;
	}
	while (player->health < (accuracy - 1 - level) * (max / accuracy))
	{
		level++;
	}
	if (CurrentState != NULL)
	{
		int skin = player->userinfo.GetSkin();
		const char *skin_face = (stateflags & FMugShot::CUSTOM) ? nullptr : (player->morphTics ? player->MorphedPlayerClass->Face.GetChars() : skins[skin].face);
		return CurrentState->GetCurrentFrameTexture(default_face, skin_face, level, angle);
	}
	return NULL;
}